

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-file.c
# Opt level: O3

void path_process(char *buf,size_t len,size_t *cur_len,char *path)

{
  __uid_t __uid;
  char *pcVar1;
  ulong uVar2;
  passwd *ppVar3;
  char *__s;
  char user [128];
  char local_b8 [136];
  
  pcVar1 = path;
  if (*path == '~') {
    __s = path + 1;
    pcVar1 = strchr(__s,0x2f);
    if (pcVar1 != (char *)0x0) {
      if (path + 0x81 <= pcVar1) {
        return;
      }
      if (__s < pcVar1) {
        memcpy(local_b8,__s,(size_t)(pcVar1 + ~(ulong)path));
        uVar2 = (ulong)(pcVar1 + ~(ulong)path) & 0xffffffff;
      }
      else {
        uVar2 = 0;
      }
      local_b8[uVar2] = '\0';
      __s = local_b8;
    }
    if (*__s == '\0') {
      __uid = getuid();
      ppVar3 = getpwuid(__uid);
    }
    else {
      ppVar3 = getpwnam(__s);
    }
    if ((ppVar3 == (passwd *)0x0) ||
       (strnfcat(buf,len,cur_len,"%s%s",ppVar3->pw_dir,"/"), pcVar1 == (char *)0x0)) {
      return;
    }
  }
  strnfcat(buf,len,cur_len,"%s",pcVar1);
  return;
}

Assistant:

static void path_process(char *buf, size_t len, size_t *cur_len,
						 const char *path)
{
#if defined(UNIX)

	/* Home directory on Unixes */
	if (path[0] == '~') {
		const char *s;
		const char *username = path + 1;

		struct passwd *pw;
		char user[128];

		/* Look for non-user portion of the file */
		s = strstr(username, PATH_SEP);
		if (s) {
			int i;

			/* Keep username a decent length */
			if (s >= username + sizeof(user)) return;

			for (i = 0; username < s; ++i) user[i] = *username++;
			user[i] = '\0';
			username = user;
		}

		/* Look up a user (or "current" user) */
		pw = username[0] ? getpwnam(username) : getpwuid(getuid());
		if (!pw) return;

		/* Copy across */
		strnfcat(buf, len, cur_len, "%s%s", pw->pw_dir, PATH_SEP);
		if (s) strnfcat(buf, len, cur_len, "%s", s);
	} else

#endif /* defined(UNIX) */

		strnfcat(buf, len, cur_len, "%s", path);
}